

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O2

Status __thiscall
leveldb::DoWriteStringToFile(leveldb *this,Env *env,Slice *data,string *fname,bool should_sync)

{
  char *pcVar1;
  long lVar2;
  WritableFile *file;
  Status local_40;
  long *local_38;
  Status local_30;
  
  (*env->_vptr_Env[4])(this,env,fname,&local_38);
  if (*(long *)this == 0) {
    (**(code **)(*local_38 + 0x10))(&local_40,local_38,data);
    pcVar1 = *(char **)this;
    *(char **)this = local_40.state_;
    local_40.state_ = pcVar1;
    Status::~Status(&local_40);
    lVar2 = *(long *)this;
    if (should_sync && lVar2 == 0) {
      (**(code **)(*local_38 + 0x28))(&local_40);
      pcVar1 = *(char **)this;
      *(char **)this = local_40.state_;
      local_40.state_ = pcVar1;
      Status::~Status(&local_40);
      lVar2 = *(long *)this;
    }
    if (lVar2 == 0) {
      (**(code **)(*local_38 + 0x18))(&local_40);
      pcVar1 = *(char **)this;
      *(char **)this = local_40.state_;
      local_40.state_ = pcVar1;
      Status::~Status(&local_40);
    }
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    if (*(long *)this != 0) {
      (*env->_vptr_Env[8])(&local_30,env,fname);
      Status::~Status(&local_30);
    }
  }
  return (Status)(char *)this;
}

Assistant:

static Status DoWriteStringToFile(Env* env, const Slice& data,
                                  const std::string& fname, bool should_sync) {
  WritableFile* file;
  Status s = env->NewWritableFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  s = file->Append(data);
  if (s.ok() && should_sync) {
    s = file->Sync();
  }
  if (s.ok()) {
    s = file->Close();
  }
  delete file;  // Will auto-close if we did not close above
  if (!s.ok()) {
    env->DeleteFile(fname);
  }
  return s;
}